

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

ShutdownData * google::protobuf::internal::ShutdownData::get(void)

{
  int iVar1;
  ShutdownData *this;
  
  if (get()::data == '\0') {
    iVar1 = __cxa_guard_acquire(&get()::data);
    if (iVar1 != 0) {
      this = (ShutdownData *)operator_new(0x20);
      ShutdownData(this);
      get::data = this;
      __cxa_guard_release(&get()::data);
    }
  }
  return get::data;
}

Assistant:

static ShutdownData* get() {
    static auto* data = new ShutdownData;
    return data;
  }